

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

Statement * SQCompilation::unwrapBody(Statement *stmt)

{
  int iVar1;
  
  while( true ) {
    if (stmt == (Statement *)0x0) {
      return (Statement *)0x0;
    }
    if ((stmt->super_Node)._op != TO_BLOCK) break;
    iVar1 = stmt[1].super_Node._coordinates.lineEnd;
    if (iVar1 == 0) {
      return (Statement *)0x0;
    }
    stmt = *(Statement **)(*(long *)&stmt[1].super_Node._coordinates + (ulong)(iVar1 - 1) * 8);
  }
  return stmt;
}

Assistant:

static const Statement *unwrapBody(const Statement *stmt) {
  if (!stmt)
    return nullptr;

  if (stmt->op() != TO_BLOCK)
    return stmt;

  auto &stmts = stmt->asBlock()->statements();

  if (stmts.empty())
    return nullptr;

  return unwrapBody(stmts.back());
}